

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opensketch.h
# Opt level: O0

void __thiscall OpenSketch<4U>::OpenSketch(OpenSketch<4U> *this,int num,int _HIT)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  void *pvVar7;
  undefined4 in_EDX;
  int in_ESI;
  undefined8 *in_RDI;
  ulong uVar8;
  uint in_stack_ffffffffffffff4c;
  Abstract<4U> *in_stack_ffffffffffffff50;
  void *local_90;
  ulong *local_58;
  
  Abstract<4U>::Abstract(in_stack_ffffffffffffff50);
  *in_RDI = &PTR_Init_00123cb0;
  std::
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  ::unordered_map((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                   *)0x110d7f);
  *(undefined4 *)(in_RDI + 0xd) = in_EDX;
  *(undefined4 *)((long)in_RDI + 0x6c) = 0x80;
  *(undefined4 *)((long)in_RDI + 0x74) = 0xfa;
  *(int *)(in_RDI + 0xe) =
       (int)((ulong)((long)in_ESI + (long)(*(int *)((long)in_RDI + 0x74) * 6) * -8) / 0x14);
  *(undefined4 *)(in_RDI + 0xf) = 0;
  uVar4 = (ulong)*(int *)(in_RDI + 0xe);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar4;
  uVar5 = SUB168(auVar1 * ZEXT816(0x10),0);
  uVar8 = uVar5 + 8;
  if (0xfffffffffffffff7 < uVar5) {
    uVar8 = 0xffffffffffffffff;
  }
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  puVar6 = (ulong *)operator_new__(uVar8);
  *puVar6 = uVar4;
  puVar6 = puVar6 + 1;
  if (uVar4 != 0) {
    local_58 = puVar6;
    do {
      BitSet::BitSet((BitSet *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      local_58 = local_58 + 2;
    } while (local_58 != puVar6 + uVar4 * 2);
  }
  in_RDI[0x10] = puVar6;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)*(int *)(in_RDI + 0xe);
  uVar4 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar7 = operator_new__(uVar4);
  in_RDI[0x11] = pvVar7;
  memset((void *)in_RDI[0x11],0,(long)*(int *)(in_RDI + 0xe) << 2);
  uVar4 = (ulong)*(int *)((long)in_RDI + 0x74);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar4;
  uVar5 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pvVar7 = operator_new__(uVar5);
  if (uVar4 != 0) {
    local_90 = pvVar7;
    do {
      std::pair<int,_Data<4U>_>::pair<int,_Data<4U>,_true>((pair<int,_Data<4U>_> *)0x110f57);
      local_90 = (void *)((long)local_90 + 8);
    } while (local_90 != (void *)((long)pvVar7 + uVar4 * 8));
  }
  in_RDI[0x19] = pvVar7;
  memset((void *)in_RDI[0x19],0,(long)*(int *)((long)in_RDI + 0x74) << 3);
  in_RDI[6] = 0;
  in_RDI[5] = 0;
  in_RDI[8] = 0;
  in_RDI[7] = 0;
  std::__cxx11::string::operator=((string *)(in_RDI + 9),"\t\t");
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"OpenSketch");
  return;
}

Assistant:

OpenSketch(int num, int _HIT) {
		this->HIT = _HIT;
		LENGTH = 128;
		CAPACITY = 250;
		COLUMN = (num - 6 * CAPACITY * sizeof(KV<DATA_LEN>)) / 20;
		heap_num = 0;
		bitset = new BitSet[COLUMN];
		counter = new int[COLUMN];
		memset(counter, 0, sizeof(int) * COLUMN);
		heap = new KV<DATA_LEN>[CAPACITY];
		memset(heap, 0, sizeof(KV<DATA_LEN>) * CAPACITY);
		this->aae = this->are = this->pr = this->cr = 0;
		this->sep = "\t\t";
		this->name = "OpenSketch";
	}